

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp,jpc_qcd_t *qcd)

{
  jpc_dec_ccp_t *local_28;
  jpc_dec_ccp_t *ccp;
  int compno;
  jpc_qcd_t *qcd_local;
  jpc_dec_cp_t *cp_local;
  
  ccp._4_4_ = 0;
  local_28 = cp->ccps;
  for (; ccp._4_4_ < cp->numcomps; ccp._4_4_ = ccp._4_4_ + 1) {
    jpc_dec_cp_setfromqcx(cp,local_28,&qcd->compparms,0);
    local_28 = local_28 + 1;
  }
  cp->flags = cp->flags | 2;
  return 0;
}

Assistant:

static int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp, jpc_qcd_t *qcd)
{
	int compno;
	jpc_dec_ccp_t *ccp;
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		jpc_dec_cp_setfromqcx(cp, ccp, &qcd->compparms, 0);
	}
	cp->flags |= JPC_QSET;
	return 0;
}